

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void test(size_t param_1)

{
  pthread_t pVar1;
  long *in_FS_OFFSET;
  int local_34;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  reference local_28;
  data_t *data;
  size_t i;
  size_t param_0_local;
  uint32_t index;
  
  data = (data_t *)0x0;
  i = param_1;
  while( true ) {
    if ((data_t *)0xf < data) {
      pVar1 = pthread_self();
      printf("t:%lx\n",pVar1);
      return;
    }
    if (0x400 < *(uint *)(*in_FS_OFFSET + -4)) {
      TLS::BASE<tls_data_t,_1024U>::_details::acquire((uint32_t *)(*in_FS_OFFSET + -4));
    }
    param_0_local._4_4_ = *(uint *)(*in_FS_OFFSET + -4);
    local_28 = std::array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL>::operator[]
                         ((array<TLS::BASE<tls_data_t,_1024U>::data_t,_1024UL> *)
                          (TLS::BASE<tls_data_t,1024u>::_d + 0x40),(ulong)param_0_local._4_4_);
    if ((local_28->_data).ptr == (int *)0x0) break;
    printf("t:%lx %p\n",local_28->_id,(local_28->_data).ptr);
    local_34 = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_30,&local_34);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_30);
    data = (data_t *)((long)&data->_id + 1);
  }
  __assert_fail("data._data.ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasonboer[P]header-only-thread-local-storage/example.cpp"
                ,0x4f,"void test(size_t)");
}

Assistant:

static void test(size_t)
{
	for (size_t i = 0; i < 16; ++i) {

		// get the tls data for this thread
		auto & data = tls::acquire();

		assert(data._data.ptr != nullptr);
		printf("t:%" PRIxPTR" %p\n", data._id, data._data.ptr);
		std::this_thread::sleep_for(std::chrono::milliseconds(10));
	}

	// tls::thread_id() will match data._id
	printf("t:%" PRIxPTR"\n", tls::thread_id()); //-V576
}